

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O1

REF_STATUS ref_face_with(REF_FACE ref_face,REF_INT *nodes,REF_INT *face)

{
  int iVar1;
  REF_INT *pRVar2;
  REF_ADJ_ITEM pRVar3;
  uint uVar4;
  long lVar5;
  REF_INT RVar6;
  ulong uVar7;
  REF_INT candidate [4];
  REF_INT target [4];
  REF_INT orig [4];
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  REF_INT *local_50;
  REF_INT local_48 [6];
  
  *face = -1;
  uVar4 = ref_face_make_canonical(nodes,&local_68);
  if (uVar4 == 0) {
    iVar1 = *nodes;
    uVar7 = 0xffffffff;
    if (-1 < (long)iVar1) {
      uVar7 = 0xffffffff;
      if (iVar1 < ref_face->adj->nnode) {
        uVar7 = (ulong)(uint)ref_face->adj->first[iVar1];
      }
    }
    if ((int)uVar7 != -1) {
      RVar6 = ref_face->adj->item[(int)uVar7].ref;
      local_50 = face;
      do {
        pRVar2 = ref_face->f2n;
        lVar5 = 0;
        do {
          local_48[lVar5] = pRVar2[RVar6 * 4 + lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        uVar4 = ref_face_make_canonical(local_48,&local_78);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",
                 0x8e,"ref_face_with",(ulong)uVar4,"canonical");
          return uVar4;
        }
        if ((((local_68 == local_78) && (local_64 == local_74)) && (local_60 == local_70)) &&
           (local_5c == local_6c)) {
          *local_50 = RVar6;
          return 0;
        }
        pRVar3 = ref_face->adj->item;
        iVar1 = pRVar3[(int)uVar7].next;
        uVar7 = (ulong)iVar1;
        if (uVar7 == 0xffffffffffffffff) {
          RVar6 = -1;
        }
        else {
          RVar6 = pRVar3[uVar7].ref;
        }
      } while (iVar1 != -1);
    }
    uVar4 = 5;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",0x89,
           "ref_face_with",(ulong)uVar4,"canonical");
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_face_with(REF_FACE ref_face, REF_INT *nodes,
                                 REF_INT *face) {
  REF_INT item, ref, node;
  REF_INT target[4], candidate[4], orig[4];

  (*face) = REF_EMPTY;

  RSS(ref_face_make_canonical(nodes, target), "canonical");

  each_ref_adj_node_item_with_ref(ref_face_adj(ref_face), nodes[0], item, ref) {
    for (node = 0; node < 4; node++)
      orig[node] = ref_face_f2n(ref_face, node, ref);
    RSS(ref_face_make_canonical(orig, candidate), "canonical");
    if (target[0] == candidate[0] && target[1] == candidate[1] &&
        target[2] == candidate[2] && target[3] == candidate[3]) {
      (*face) = ref;
      return REF_SUCCESS;
    }
  }

  return REF_NOT_FOUND;
}